

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib653.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  undefined8 uVar5;
  CURLcode ec_5;
  CURLcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  curl_mime *mime;
  curl_mimepart *field;
  int res;
  CURL *curls;
  char *URL_local;
  
  field._4_4_ = 0;
  _ec_1 = 0;
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 != 0) {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib653.c"
                  ,0x24,iVar2,uVar3);
    field._4_4_ = iVar2;
  }
  if (field._4_4_ == 0) {
    lVar4 = curl_easy_init();
    if (lVar4 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib653.c"
                    ,0x25);
      field._4_4_ = 0x7c;
    }
    if (field._4_4_ == 0) {
      _ec_1 = curl_mime_init(lVar4);
      uVar3 = curl_mime_addpart(_ec_1);
      curl_mime_name(uVar3,"name");
      curl_mime_data(uVar3,"short value",0xffffffffffffffff);
      iVar2 = curl_easy_setopt(lVar4,0x2712,URL);
      uVar1 = _stderr;
      if (iVar2 != 0) {
        uVar5 = curl_easy_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib653.c"
                      ,0x2c,iVar2,uVar5);
        field._4_4_ = iVar2;
      }
      if (field._4_4_ == 0) {
        iVar2 = curl_easy_setopt(lVar4,0x2a,1);
        uVar1 = _stderr;
        if (iVar2 != 0) {
          uVar5 = curl_easy_strerror(iVar2);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib653.c"
                        ,0x2d,iVar2,uVar5);
          field._4_4_ = iVar2;
        }
        if (field._4_4_ == 0) {
          iVar2 = curl_easy_setopt(lVar4,0x29,1);
          uVar1 = _stderr;
          if (iVar2 != 0) {
            uVar5 = curl_easy_strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib653.c"
                          ,0x2e,iVar2,uVar5);
            field._4_4_ = iVar2;
          }
          if (field._4_4_ == 0) {
            iVar2 = curl_easy_setopt(lVar4,0x281d,_ec_1);
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar5 = curl_easy_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib653.c"
                            ,0x2f,iVar2,uVar5);
              field._4_4_ = iVar2;
            }
            if (field._4_4_ == 0) {
              iVar2 = curl_easy_setopt(lVar4,0x2b,1);
              uVar1 = _stderr;
              if (iVar2 != 0) {
                uVar5 = curl_easy_strerror(iVar2);
                curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib653.c"
                              ,0x30,iVar2,uVar5);
                field._4_4_ = iVar2;
              }
              if ((field._4_4_ == 0) && (field._4_4_ = curl_easy_perform(lVar4), field._4_4_ == 0))
              {
                curl_mime_data(uVar3,"long value for length change",0xffffffffffffffff);
                field._4_4_ = curl_easy_perform(lVar4);
              }
            }
          }
        }
      }
    }
    curl_mime_free(_ec_1);
    curl_easy_cleanup(lVar4);
    curl_global_cleanup();
    URL_local._4_4_ = field._4_4_;
  }
  else {
    URL_local._4_4_ = field._4_4_;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *curls = NULL;
  int res = 0;
  curl_mimepart *field = NULL;
  curl_mime *mime = NULL;

  global_init(CURL_GLOBAL_ALL);
  easy_init(curls);

  mime = curl_mime_init(curls);
  field = curl_mime_addpart(mime);
  curl_mime_name(field, "name");
  curl_mime_data(field, "short value", CURL_ZERO_TERMINATED);

  easy_setopt(curls, CURLOPT_URL, URL);
  easy_setopt(curls, CURLOPT_HEADER, 1L);
  easy_setopt(curls, CURLOPT_VERBOSE, 1L);
  easy_setopt(curls, CURLOPT_MIMEPOST, mime);
  easy_setopt(curls, CURLOPT_NOPROGRESS, 1L);

  res = curl_easy_perform(curls);
  if(res)
    goto test_cleanup;

  /* Alter form and resubmit. */
  curl_mime_data(field, "long value for length change", CURL_ZERO_TERMINATED);
  res = curl_easy_perform(curls);

test_cleanup:
  curl_mime_free(mime);
  curl_easy_cleanup(curls);
  curl_global_cleanup();
  return (int) res; /* return the final return code */
}